

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableRead.cpp
# Opt level: O3

VariableRead * __thiscall ninx::parser::element::VariableRead::clone_impl(VariableRead *this)

{
  pointer pcVar1;
  VariableRead *pVVar2;
  
  pVVar2 = (VariableRead *)operator_new(0x40);
  (pVVar2->super_Expression).super_Statement.super_ASTElement.parent = (Block *)0x0;
  (pVVar2->super_Expression).super_Statement.super_ASTElement.__output_block = (Block *)0x0;
  (pVVar2->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__VariableRead_00150288;
  (pVVar2->name)._M_dataplus._M_p = (pointer)&(pVVar2->name).field_2;
  pcVar1 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pVVar2->name,pcVar1,pcVar1 + (this->name)._M_string_length);
  pVVar2->trailing_spaces = 0;
  return pVVar2;
}

Assistant:

ninx::parser::element::VariableRead * ninx::parser::element::VariableRead::clone_impl() {
    return new VariableRead(this->name, 0);
}